

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

bool testing::internal::ParseNaturalNumber<int>(string *str,int *number)

{
  bool bVar1;
  ulong uVar2;
  int *piVar3;
  char *__nptr;
  ostream *poVar4;
  int *in_RSI;
  ulong in_RDI;
  int result;
  int in_stack_0000001c;
  char *in_stack_00000020;
  GTestLogSeverity in_stack_0000002c;
  bool parse_success;
  BiggestConvertible parsed;
  char *end;
  GTestLog *this;
  bool local_41;
  GTestLog local_30;
  bool local_29;
  ulonglong local_28;
  char *local_20;
  int *local_18;
  ulong local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator[](local_10);
    bVar1 = IsDigit('\0');
    if (bVar1) {
      piVar3 = __errno_location();
      *piVar3 = 0;
      __nptr = (char *)std::__cxx11::string::c_str();
      local_28 = strtoull(__nptr,&local_20,10);
      local_41 = false;
      if (*local_20 == '\0') {
        piVar3 = __errno_location();
        local_41 = *piVar3 == 0;
      }
      local_29 = local_41;
      bVar1 = IsTrue(true);
      if (!bVar1) {
        this = &local_30;
        GTestLog::GTestLog((GTestLog *)parsed,in_stack_0000002c,in_stack_00000020,in_stack_0000001c)
        ;
        poVar4 = GTestLog::GetStream(this);
        std::operator<<(poVar4,"Condition sizeof(Integer) <= sizeof(parsed) failed. ");
        GTestLog::~GTestLog(this);
      }
      if (((local_29 & 1U) != 0) && ((long)(int)local_28 == local_28)) {
        *local_18 = (int)local_28;
        return true;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool ParseNaturalNumber(const ::std::string& str, Integer* number) {
  // Fail fast if the given string does not begin with a digit;
  // this bypasses strtoXXX's "optional leading whitespace and plus
  // or minus sign" semantics, which are undesirable here.
  if (str.empty() || !IsDigit(str[0])) {
    return false;
  }
  errno = 0;

  char* end;
  // BiggestConvertible is the largest integer type that system-provided
  // string-to-number conversion routines can return.

# if GTEST_OS_WINDOWS && !defined(__GNUC__)

  // MSVC and C++ Builder define __int64 instead of the standard long long.
  typedef unsigned __int64 BiggestConvertible;
  const BiggestConvertible parsed = _strtoui64(str.c_str(), &end, 10);

# else

  typedef unsigned long long BiggestConvertible;  // NOLINT
  const BiggestConvertible parsed = strtoull(str.c_str(), &end, 10);

# endif  // GTEST_OS_WINDOWS && !defined(__GNUC__)

  const bool parse_success = *end == '\0' && errno == 0;

  // TODO(vladl@google.com): Convert this to compile time assertion when it is
  // available.
  GTEST_CHECK_(sizeof(Integer) <= sizeof(parsed));

  const Integer result = static_cast<Integer>(parsed);
  if (parse_success && static_cast<BiggestConvertible>(result) == parsed) {
    *number = result;
    return true;
  }
  return false;
}